

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(ColumnChunk *a,ColumnChunk *b)

{
  _ColumnCryptoMetaData__isset _Var1;
  _ColumnChunk__isset _Var2;
  int32_t iVar3;
  int64_t iVar4;
  
  std::__cxx11::string::swap((string *)&a->file_path);
  iVar4 = a->file_offset;
  a->file_offset = b->file_offset;
  b->file_offset = iVar4;
  swap(&a->meta_data,&b->meta_data);
  iVar4 = a->offset_index_offset;
  a->offset_index_offset = b->offset_index_offset;
  b->offset_index_offset = iVar4;
  iVar3 = a->offset_index_length;
  a->offset_index_length = b->offset_index_length;
  b->offset_index_length = iVar3;
  iVar4 = a->column_index_offset;
  a->column_index_offset = b->column_index_offset;
  b->column_index_offset = iVar4;
  iVar3 = a->column_index_length;
  a->column_index_length = b->column_index_length;
  b->column_index_length = iVar3;
  swap(&(a->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY,
       &(b->crypto_metadata).ENCRYPTION_WITH_COLUMN_KEY);
  _Var1 = (a->crypto_metadata).__isset;
  (a->crypto_metadata).__isset = (b->crypto_metadata).__isset;
  (b->crypto_metadata).__isset = _Var1;
  std::__cxx11::string::swap((string *)&a->encrypted_column_metadata);
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(ColumnChunk &a, ColumnChunk &b) {
  using ::std::swap;
  swap(a.file_path, b.file_path);
  swap(a.file_offset, b.file_offset);
  swap(a.meta_data, b.meta_data);
  swap(a.offset_index_offset, b.offset_index_offset);
  swap(a.offset_index_length, b.offset_index_length);
  swap(a.column_index_offset, b.column_index_offset);
  swap(a.column_index_length, b.column_index_length);
  swap(a.crypto_metadata, b.crypto_metadata);
  swap(a.encrypted_column_metadata, b.encrypted_column_metadata);
  swap(a.__isset, b.__isset);
}